

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-list.c
# Opt level: O2

object_list_t * object_list_new(void)

{
  object_list_t *p;
  object_list_entry_t *poVar1;
  
  p = (object_list_t *)mem_zalloc(0x28);
  if (p != (object_list_t *)0x0) {
    poVar1 = (object_list_entry_t *)mem_zalloc(0xa000);
    p->entries = poVar1;
    if (poVar1 != (object_list_entry_t *)0x0) {
      p->entries_size = 0xa00;
      return p;
    }
    mem_free(p);
  }
  return (object_list_t *)0x0;
}

Assistant:

object_list_t *object_list_new(void)
{
	object_list_t *list = mem_zalloc(sizeof(object_list_t));
	size_t size = MAX_ITEMLIST;

	if (list == NULL)
		return NULL;

	list->entries = mem_zalloc(size * sizeof(object_list_entry_t));

	if (list->entries == NULL) {
		mem_free(list);
		return NULL;
	}

	list->entries_size = size;

	return list;
}